

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  BuiltStyledStreamWriter *this_00;
  undefined1 local_100 [8];
  string endingLineFeedSymbol;
  undefined1 local_d8 [8];
  string nullSymbol;
  undefined1 local_b0 [8];
  string colonSymbol;
  string local_88;
  Enum local_68;
  uint local_64;
  Enum cs;
  uint pre;
  bool usf;
  bool dnp;
  bool eyc;
  undefined1 local_50 [8];
  string cs_str;
  string indentation;
  StreamWriterBuilder *this_local;
  
  pVVar2 = Value::operator[](&this->settings_,"indentation");
  Value::asString_abi_cxx11_((string *)((long)&cs_str.field_2 + 8),pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"commentStyle");
  Value::asString_abi_cxx11_((string *)local_50,pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"enableYAMLCompatibility");
  cs._3_1_ = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"dropNullPlaceholders");
  cs._2_1_ = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"useSpecialFloats");
  cs._1_1_ = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"precision");
  local_64 = Value::asUInt(pVVar2);
  local_68 = 2;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"All");
  if (bVar1) {
    local_68 = All;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"None");
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"commentStyle must be \'All\' or \'None\'",
                 (allocator<char> *)(colonSymbol.field_2._M_local_buf + 0xf));
      throwRuntimeError(&local_88);
    }
    local_68 = None;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0," : ",(allocator<char> *)(nullSymbol.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(nullSymbol.field_2._M_local_buf + 0xf));
  if ((cs._3_1_ & 1) == None >> 0x18) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_b0,":");
    }
  }
  else {
    std::__cxx11::string::operator=((string *)local_b0,": ");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"null",
             (allocator<char> *)(endingLineFeedSymbol.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(endingLineFeedSymbol.field_2._M_local_buf + 0xf));
  if ((cs._2_1_ & 1) != None >> 0x10) {
    std::__cxx11::string::clear();
  }
  if (0x11 < local_64) {
    local_64 = 0x11;
  }
  std::__cxx11::string::string((string *)local_100);
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe0);
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,(string *)((long)&cs_str.field_2 + 8),local_68,(string *)local_b0,
             (string *)local_d8,(string *)local_100,(bool)(cs._1_1_ & 1),local_64);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(cs_str.field_2._M_local_buf + 8));
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const
{
  JSONCPP_STRING indentation = settings_["indentation"].asString();
  JSONCPP_STRING cs_str = settings_["commentStyle"].asString();
  bool eyc = settings_["enableYAMLCompatibility"].asBool();
  bool dnp = settings_["dropNullPlaceholders"].asBool();
  bool usf = settings_["useSpecialFloats"].asBool(); 
  unsigned int pre = settings_["precision"].asUInt();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  JSONCPP_STRING colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  JSONCPP_STRING nullSymbol = "null";
  if (dnp) {
    nullSymbol.clear();
  }
  if (pre > 17) pre = 17;
  JSONCPP_STRING endingLineFeedSymbol;
  return new BuiltStyledStreamWriter(
      indentation, cs,
      colonSymbol, nullSymbol, endingLineFeedSymbol, usf, pre);
}